

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::hasSingleNextBlock
          (InvocationInterlockPlacementPass *this,uint32_t block_id,bool reverse_cfg)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  CFG *pCVar4;
  Instruction *pIVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar6;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  BasicBlock *block;
  bool reverse_cfg_local;
  InvocationInterlockPlacementPass *pIStack_18;
  uint32_t block_id_local;
  InvocationInterlockPlacementPass *this_local;
  
  block._3_1_ = reverse_cfg;
  block._4_4_ = block_id;
  pIStack_18 = this;
  if (reverse_cfg) {
    pCVar4 = Pass::cfg(&this->super_Pass);
    local_30._8_8_ = CFG::block(pCVar4,block._4_4_);
    BasicBlock::tail((BasicBlock *)local_30);
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_30);
    OVar2 = opt::Instruction::opcode(pIVar5);
    if (OVar2 == OpBranchConditional) {
      this_local._7_1_ = false;
    }
    else if (OVar2 == OpSwitch) {
      BasicBlock::tail((BasicBlock *)(local_40 + 8));
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_40 + 8));
      uVar3 = opt::Instruction::NumInOperandWords(pIVar5);
      this_local._7_1_ = uVar3 == 1;
    }
    else {
      BasicBlock::tail((BasicBlock *)local_40);
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_40);
      bVar1 = opt::Instruction::IsReturnOrAbort(pIVar5);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    pCVar4 = Pass::cfg(&this->super_Pass);
    this_00 = CFG::preds(pCVar4,block._4_4_);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    this_local._7_1_ = sVar6 == 1;
  }
  return this_local._7_1_;
}

Assistant:

bool InvocationInterlockPlacementPass::hasSingleNextBlock(uint32_t block_id,
                                                          bool reverse_cfg) {
  if (reverse_cfg) {
    // We are traversing forward, so check whether there is a single successor.
    BasicBlock* block = cfg()->block(block_id);

    switch (block->tail()->opcode()) {
      case spv::Op::OpBranchConditional:
        return false;
      case spv::Op::OpSwitch:
        return block->tail()->NumInOperandWords() == 1;
      default:
        return !block->tail()->IsReturnOrAbort();
    }
  } else {
    // We are traversing backward, so check whether there is a single
    // predecessor.
    return cfg()->preds(block_id).size() == 1;
  }
}